

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O3

void __thiscall tonk::gateway::StateMachine::API_Request(StateMachine *this,AppRequest *request)

{
  pointer *ppAVar1;
  iterator __position;
  MappedPortLifetime *pMVar2;
  undefined2 uVar3;
  RequestType RVar4;
  int iVar5;
  AppRequest *pAVar6;
  
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->API_Lock);
  if (iVar5 != 0) {
    std::__throw_system_error(iVar5);
  }
  pAVar6 = (this->API_Requests).
           super__Vector_base<tonk::gateway::AppRequest,_std::allocator<tonk::gateway::AppRequest>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (this->API_Requests).
       super__Vector_base<tonk::gateway::AppRequest,_std::allocator<tonk::gateway::AppRequest>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (pAVar6 != __position._M_current) {
    do {
      if (pAVar6->LocalPort == request->LocalPort) {
        uVar3 = *(undefined2 *)&request->field_0x2;
        RVar4 = request->Type;
        pMVar2 = request->API_LifetimePtr;
        pAVar6->LocalPort = request->LocalPort;
        *(undefined2 *)&pAVar6->field_0x2 = uVar3;
        pAVar6->Type = RVar4;
        pAVar6->API_LifetimePtr = pMVar2;
        goto LAB_00137787;
      }
      pAVar6 = pAVar6 + 1;
    } while (pAVar6 != __position._M_current);
  }
  if (__position._M_current ==
      (this->API_Requests).
      super__Vector_base<tonk::gateway::AppRequest,_std::allocator<tonk::gateway::AppRequest>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<tonk::gateway::AppRequest,std::allocator<tonk::gateway::AppRequest>>::
    _M_realloc_insert<tonk::gateway::AppRequest_const&>
              ((vector<tonk::gateway::AppRequest,std::allocator<tonk::gateway::AppRequest>> *)
               &this->API_Requests,__position,request);
  }
  else {
    uVar3 = *(undefined2 *)&request->field_0x2;
    RVar4 = request->Type;
    pMVar2 = request->API_LifetimePtr;
    (__position._M_current)->LocalPort = request->LocalPort;
    *(undefined2 *)&(__position._M_current)->field_0x2 = uVar3;
    (__position._M_current)->Type = RVar4;
    (__position._M_current)->API_LifetimePtr = pMVar2;
    ppAVar1 = &(this->API_Requests).
               super__Vector_base<tonk::gateway::AppRequest,_std::allocator<tonk::gateway::AppRequest>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppAVar1 = *ppAVar1 + 1;
  }
LAB_00137787:
  LOCK();
  (this->API_Requests_Updated)._M_base._M_i = true;
  UNLOCK();
  pthread_mutex_unlock((pthread_mutex_t *)&this->API_Lock);
  AsioHost::DispatchTick(this->Host);
  return;
}

Assistant:

void StateMachine::API_Request(const AppRequest& request)
{
    TONK_DEBUG_ASSERT(request.LocalPort != 0);

    // This will be called from the application

    // Hold API lock while accessing the requests list
    {
        std::lock_guard<std::mutex> locker(API_Lock);

        bool found = false;
        for (auto& r : API_Requests)
        {
            // Note: Requests are uniquely identified by ports
            if (r.LocalPort == request.LocalPort)
            {
                r = request;
                found = true;
                break;
            }
        }

        if (!found) {
            API_Requests.push_back(request);
        }

        // Set the dirty flag
        API_Requests_Updated = true;
    }

    // Run OnTick() immediately
    Host->DispatchTick();
}